

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool parseCmakeBoolean(QJsonValue *value)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QStringView QVar8;
  QArrayData *local_98 [3];
  QArrayData *local_80 [3];
  QArrayData *local_68 [3];
  QArrayData *local_50 [3];
  QArrayData *local_38;
  storage_type *psStack_30;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_30 = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonValue::toString();
  QVar4.m_data = &DAT_00000004;
  QVar4.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar4);
  iVar1 = QString::compare((QString *)&local_38,(CaseSensitivity)local_50);
  bVar3 = true;
  if (iVar1 == 0) {
    QVar5.m_data = (storage_type_conflict *)0x2;
    QVar5.m_size = (qsizetype)local_68;
    QString::fromUtf8(QVar5);
    iVar1 = QString::compare((QString *)&local_38,(CaseSensitivity)local_68);
    bVar3 = true;
    if (iVar1 == 0) {
      QVar6.m_data = (storage_type_conflict *)0x3;
      QVar6.m_size = (qsizetype)local_80;
      QString::fromUtf8(QVar6);
      iVar1 = QString::compare((QString *)&local_38,(CaseSensitivity)local_80);
      bVar3 = true;
      if (iVar1 == 0) {
        QVar7.m_data = (storage_type_conflict *)0x1;
        QVar7.m_size = (qsizetype)local_98;
        QString::fromUtf8(QVar7);
        iVar1 = QString::compare((QString *)&local_38,(CaseSensitivity)local_98);
        bVar3 = true;
        if (iVar1 == 0) {
          QVar8.m_data = psStack_30;
          QVar8.m_size = (qsizetype)local_28;
          lVar2 = QString::toIntegral_helper(QVar8,(bool *)0x0,10);
          bVar3 = lVar2 - 1U < 0x7fffffff;
        }
        if (local_98[0] != (QArrayData *)0x0) {
          LOCK();
          (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98[0],2,0x10);
          }
        }
      }
      if (local_80[0] != (QArrayData *)0x0) {
        LOCK();
        (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_80[0],2,0x10);
        }
      }
    }
    if (local_68[0] != (QArrayData *)0x0) {
      LOCK();
      (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68[0],2,0x10);
      }
    }
  }
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool parseCmakeBoolean(const QJsonValue &value)
{
    const QString stringValue = value.toString();
    return (stringValue.compare(QString::fromUtf8("true"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("on"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("yes"), Qt::CaseInsensitive)
                 || stringValue.compare(QString::fromUtf8("y"), Qt::CaseInsensitive)
                 || stringValue.toInt() > 0);
}